

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reconstruction.cpp
# Opt level: O3

void lts2::RealReconstructionWithTVL1
               (Mat *x,LBDOperator *LBD,Mat *binaryDescriptor,int iterations,float lambda,
               Size patchSize,float patchMean)

{
  float fVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  _InputArray *p_Var17;
  int iVar18;
  undefined4 in_XMM0_Db;
  double dVar19;
  undefined4 in_XMM0_Dc;
  undefined4 in_XMM0_Dd;
  Mat u_n;
  Mat Au;
  Mat u_;
  Mat q;
  Mat p2;
  Mat p1;
  Mat divP;
  Mat Du1;
  Mat u_nm1;
  Mat Du2;
  _OutputArray local_740;
  Mat *local_728;
  LBDOperator *local_720;
  float local_714;
  Mat *local_710;
  Mat *local_708;
  Mat *local_700;
  float local_6f8;
  undefined4 uStack_6f4;
  undefined4 uStack_6f0;
  undefined4 uStack_6ec;
  undefined1 local_6e8 [16];
  undefined1 local_6d8 [16];
  Mat local_678 [96];
  Mat aMStack_618 [144];
  _InputArray local_588 [4];
  ulong local_528;
  ulong uStack_520;
  undefined8 local_510;
  undefined8 local_508;
  undefined8 local_500;
  undefined8 local_4f8;
  undefined1 local_4f0 [16];
  Size local_4e0;
  Mat local_480 [96];
  Mat aMStack_420 [144];
  _InputArray local_390 [4];
  Mat local_330 [64];
  undefined8 *local_2f0;
  _InputArray local_2d0 [4];
  _InputArray local_270 [4];
  _InputArray local_210 [4];
  _InputArray local_1b0 [4];
  _OutputArray local_150 [4];
  Mat local_f0 [96];
  Mat local_90 [96];
  
  fVar1 = (LBD->super_LinearOperator)._norm;
  local_720 = LBD;
  local_714 = patchMean;
  local_710 = x;
  local_6f8 = lambda;
  uStack_6f4 = in_XMM0_Db;
  uStack_6f0 = in_XMM0_Dc;
  uStack_6ec = in_XMM0_Dd;
  cv::Mat::Mat(local_330);
  cv::Mat::Mat((Mat *)local_390);
  cv::Mat::Mat((Mat *)local_588);
  cv::Mat::Mat(local_f0);
  cv::Mat::Mat((Mat *)local_150);
  cv::Mat::Mat(local_90);
  cv::Mat::Mat((Mat *)local_210);
  cv::Mat::Mat((Mat *)local_270);
  cv::Mat::Mat((Mat *)local_1b0);
  cv::Mat::Mat((Mat *)local_2d0);
  local_4f8 = CONCAT44((int)**(undefined8 **)(binaryDescriptor + 0x40),
                       (int)((ulong)**(undefined8 **)(binaryDescriptor + 0x40) >> 0x20));
  local_728 = binaryDescriptor;
  cv::Mat::create(local_390,&local_4f8,5);
  local_6d8 = (undefined1  [16])0x0;
  local_6e8 = (undefined1  [16])0x0;
  local_4f0._0_4_ = -0x3efdfffa;
  local_4e0 = (Size)&DAT_400000001;
  local_4f0._8_8_ = local_6e8;
  cv::noArray();
  cv::Mat::setTo(local_390,(_InputArray *)local_4f0);
  if (*(long *)(local_710 + 0x10) == 0) {
    (*(local_720->super_LinearOperator)._vptr_LinearOperator[3])(local_720,local_728,local_588);
    local_6d8 = (undefined1  [16])0x0;
    local_6e8 = (undefined1  [16])0x0;
    local_4f0._0_4_ = -0x3efdfffa;
    local_4e0 = (Size)&DAT_400000001;
    local_4f0._8_8_ = local_6e8;
    cv::noArray();
    cv::Mat::setTo(local_588,(_InputArray *)local_4f0);
  }
  else {
    auVar2._8_8_ = 0;
    auVar2._0_8_ = local_6d8._8_8_;
    local_6d8 = auVar2 << 0x40;
    local_6e8._0_4_ = 0x2010000;
    local_6e8._8_8_ = local_588;
    cv::Mat::copyTo((_OutputArray *)local_710);
  }
  auVar15._8_8_ = 0;
  auVar15._0_8_ = local_6d8._8_8_;
  local_6d8 = auVar15 << 0x40;
  local_6e8._0_4_ = 0x2010000;
  local_6e8._8_8_ = local_330;
  cv::Mat::copyTo((_OutputArray *)local_588);
  local_500 = CONCAT44((int)*local_2f0,(int)((ulong)*local_2f0 >> 0x20));
  cv::Mat::create(local_210,&local_500,5);
  local_6d8 = (undefined1  [16])0x0;
  local_6e8 = (undefined1  [16])0x0;
  local_4f0._0_4_ = -0x3efdfffa;
  local_4e0 = (Size)&DAT_400000001;
  local_4f0._8_8_ = (_InputArray *)local_6e8;
  cv::noArray();
  cv::Mat::setTo(local_210,(_InputArray *)local_4f0);
  local_508 = CONCAT44((int)*local_2f0,(int)((ulong)*local_2f0 >> 0x20));
  cv::Mat::create(local_270,&local_508,5);
  local_6d8 = (undefined1  [16])0x0;
  local_6e8 = (undefined1  [16])0x0;
  local_4f0._0_4_ = -0x3efdfffa;
  local_4e0 = (Size)&DAT_400000001;
  local_4f0._8_8_ = (_InputArray *)local_6e8;
  cv::noArray();
  cv::Mat::setTo(local_270,(_InputArray *)local_4f0);
  local_510 = CONCAT44((int)**(undefined8 **)(local_728 + 0x40),
                       (int)((ulong)**(undefined8 **)(local_728 + 0x40) >> 0x20));
  cv::Mat::create(local_2d0,&local_510,5);
  local_6d8 = (undefined1  [16])0x0;
  local_6e8 = (undefined1  [16])0x0;
  local_4f0._0_4_ = -0x3efdfffa;
  local_4e0 = (Size)&DAT_400000001;
  local_4f0._8_8_ = (_InputArray *)local_6e8;
  cv::noArray();
  cv::Mat::setTo(local_2d0,(_InputArray *)local_4f0);
  if (0 < iterations) {
    dVar19 = (double)(1.0 / SQRT(fVar1 * fVar1 + 8.0));
    local_528 = CONCAT44(uStack_6f4,local_6f8) ^ 0x8000000080000000;
    uStack_520 = CONCAT44(uStack_6ec,uStack_6f0) ^ 0x8000000080000000;
    local_708 = aMStack_618;
    local_700 = aMStack_420;
    do {
      HorizontalGradientWithForwardScheme(local_330,(Mat *)local_150);
      auVar3._8_8_ = 0;
      auVar3._0_8_ = local_6d8._8_8_;
      local_6d8 = auVar3 << 0x40;
      local_6e8._0_4_ = 0x2010000;
      local_6e8._8_8_ = local_150;
      iVar18 = (int)(_InputArray *)local_6e8;
      cv::Mat::convertTo(local_150,iVar18,dVar19,0.0);
      auVar4._8_8_ = 0;
      auVar4._0_8_ = local_6d8._8_8_;
      local_6d8 = auVar4 << 0x40;
      local_6e8._0_4_ = 0x1010000;
      local_740.super__InputArray.obj = local_210;
      local_6e8._8_8_ = local_740.super__InputArray.obj;
      local_4e0.width = 0;
      local_4e0.height = 0;
      local_4f0._0_4_ = 0x1010000;
      local_740.super__InputArray.sz.width = 0;
      local_740.super__InputArray.sz.height = 0;
      local_740.super__InputArray.flags = -0x3dff0000;
      local_4f0._8_8_ = local_150;
      p_Var17 = (_InputArray *)cv::noArray();
      cv::add((_InputArray *)local_6e8,(_InputArray *)local_4f0,&local_740,p_Var17,-1);
      VerticalGradientWithForwardScheme(local_330,local_90);
      auVar5._8_8_ = 0;
      auVar5._0_8_ = local_6d8._8_8_;
      local_6d8 = auVar5 << 0x40;
      local_6e8._0_4_ = 0x2010000;
      local_6e8._8_8_ = local_90;
      cv::Mat::convertTo((_OutputArray *)local_90,iVar18,dVar19,0.0);
      auVar6._8_8_ = 0;
      auVar6._0_8_ = local_6d8._8_8_;
      local_6d8 = auVar6 << 0x40;
      local_6e8._0_4_ = 0x1010000;
      local_740.super__InputArray.obj = local_270;
      local_6e8._8_8_ = local_740.super__InputArray.obj;
      local_4e0.width = 0;
      local_4e0.height = 0;
      local_4f0._0_4_ = 0x1010000;
      local_740.super__InputArray.sz.width = 0;
      local_740.super__InputArray.sz.height = 0;
      local_740.super__InputArray.flags = -0x3dff0000;
      local_4f0._8_8_ = local_90;
      p_Var17 = (_InputArray *)cv::noArray();
      cv::add((_InputArray *)local_6e8,(_InputArray *)local_4f0,&local_740,p_Var17,-1);
      ProxL2UnitBall((Mat *)local_210,(Mat *)local_270);
      (*(local_720->super_LinearOperator)._vptr_LinearOperator[2])(local_720,local_330,local_390);
      auVar7._8_8_ = 0;
      auVar7._0_8_ = local_6d8._8_8_;
      local_6d8 = auVar7 << 0x40;
      local_6e8._0_4_ = 0x1010000;
      local_740.super__InputArray.obj = local_390;
      local_6e8._8_8_ = local_740.super__InputArray.obj;
      local_4e0.width = 0;
      local_4e0.height = 0;
      local_4f0._0_4_ = 0x1010000;
      local_4f0._8_8_ = local_728;
      local_740.super__InputArray.sz.width = 0;
      local_740.super__InputArray.sz.height = 0;
      local_740.super__InputArray.flags = -0x3dff0000;
      p_Var17 = (_InputArray *)cv::noArray();
      cv::subtract((_InputArray *)local_6e8,(_InputArray *)local_4f0,&local_740,p_Var17,-1);
      auVar8._8_8_ = 0;
      auVar8._0_8_ = local_6d8._8_8_;
      local_6d8 = auVar8 << 0x40;
      local_6e8._0_4_ = 0x2010000;
      local_6e8._8_8_ = local_390;
      cv::Mat::convertTo((_OutputArray *)local_390,iVar18,dVar19,0.0);
      auVar9._8_8_ = 0;
      auVar9._0_8_ = local_6d8._8_8_;
      local_6d8 = auVar9 << 0x40;
      local_6e8._0_4_ = 0x1010000;
      local_740.super__InputArray.obj = local_2d0;
      local_6e8._8_8_ = local_740.super__InputArray.obj;
      local_4e0.width = 0;
      local_4e0.height = 0;
      local_4f0._0_4_ = 0x1010000;
      local_740.super__InputArray.sz.width = 0;
      local_740.super__InputArray.sz.height = 0;
      local_740.super__InputArray.flags = -0x3dff0000;
      local_4f0._8_8_ = local_390;
      p_Var17 = (_InputArray *)cv::noArray();
      cv::add((_InputArray *)local_6e8,(_InputArray *)local_4f0,&local_740,p_Var17,-1);
      ProxRangeConstraint((Mat *)local_2d0,(float)local_528,local_6f8);
      auVar10._8_8_ = 0;
      auVar10._0_8_ = local_6d8._8_8_;
      local_6d8 = auVar10 << 0x40;
      local_6e8._0_4_ = 0x2010000;
      local_6e8._8_8_ = local_f0;
      cv::Mat::copyTo((_OutputArray *)local_588);
      DivergenceWithBackwardScheme((Mat *)local_210,(Mat *)local_270,(Mat *)local_1b0);
      auVar11._8_8_ = 0;
      auVar11._0_8_ = local_6d8._8_8_;
      local_6d8 = auVar11 << 0x40;
      local_6e8._0_4_ = 0x2010000;
      local_6e8._8_8_ = local_1b0;
      cv::Mat::convertTo((_OutputArray *)local_1b0,iVar18,dVar19,0.0);
      (*(local_720->super_LinearOperator)._vptr_LinearOperator[3])(local_720,local_2d0,local_390);
      auVar12._8_8_ = 0;
      auVar12._0_8_ = local_6d8._8_8_;
      local_6d8 = auVar12 << 0x40;
      local_6e8._0_4_ = 0x2010000;
      local_6e8._8_8_ = local_390;
      cv::Mat::convertTo((_OutputArray *)local_390,iVar18,dVar19,0.0);
      auVar13._8_8_ = 0;
      auVar13._0_8_ = local_6d8._8_8_;
      local_6d8 = auVar13 << 0x40;
      local_6e8._0_4_ = 0x1010000;
      local_740.super__InputArray.obj = local_588;
      local_6e8._8_8_ = local_740.super__InputArray.obj;
      local_4e0.width = 0;
      local_4e0.height = 0;
      local_4f0._0_4_ = 0x1010000;
      local_740.super__InputArray.sz.width = 0;
      local_740.super__InputArray.sz.height = 0;
      local_740.super__InputArray.flags = -0x3dff0000;
      local_4f0._8_8_ = local_390;
      p_Var17 = (_InputArray *)cv::noArray();
      cv::subtract((_InputArray *)local_6e8,(_InputArray *)local_4f0,&local_740,p_Var17,-1);
      auVar14._8_8_ = 0;
      auVar14._0_8_ = local_6d8._8_8_;
      local_6d8 = auVar14 << 0x40;
      local_6e8._0_4_ = 0x1010000;
      local_740.super__InputArray.obj = local_588;
      local_6e8._8_8_ = local_740.super__InputArray.obj;
      local_4e0.width = 0;
      local_4e0.height = 0;
      local_4f0._0_4_ = 0x1010000;
      local_4f0._8_8_ = local_1b0;
      local_740.super__InputArray.sz.width = 0;
      local_740.super__InputArray.sz.height = 0;
      local_740.super__InputArray.flags = -0x3dff0000;
      p_Var17 = (_InputArray *)cv::noArray();
      cv::add((_InputArray *)local_6e8,(_InputArray *)local_4f0,&local_740,p_Var17,-1);
      if ((local_588[0].flags._1_1_ & 0x40) == 0) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,"OOOOOOPS, things can go wild...",0x1f);
        std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + 'x');
        std::ostream::put('x');
        std::ostream::flush();
      }
      ProxMeanConstraint((Mat *)local_588,local_714);
      ProxRangeConstraint((Mat *)local_588,0.0,1.0);
      cv::operator*(2.0,(Mat *)local_4f0);
      cv::operator-((MatExpr *)local_6e8,(Mat *)local_4f0);
      (**(code **)(*(long *)local_6e8._0_8_ + 0x18))
                (local_6e8._0_8_,(_InputArray *)local_6e8,local_330,0xffffffff);
      cv::Mat::~Mat(local_708);
      cv::Mat::~Mat(local_678);
      cv::Mat::~Mat((Mat *)local_6d8);
      cv::Mat::~Mat(local_700);
      cv::Mat::~Mat(local_480);
      cv::Mat::~Mat((Mat *)(local_4f0 + 0x10));
      iterations = iterations + -1;
    } while (iterations != 0);
  }
  auVar16._8_8_ = 0;
  auVar16._0_8_ = local_6d8._8_8_;
  local_6d8 = auVar16 << 0x40;
  local_6e8._0_4_ = 0x2010000;
  local_6e8._8_8_ = local_710;
  cv::Mat::copyTo((_OutputArray *)local_588);
  cv::Mat::~Mat((Mat *)local_2d0);
  cv::Mat::~Mat((Mat *)local_1b0);
  cv::Mat::~Mat((Mat *)local_270);
  cv::Mat::~Mat((Mat *)local_210);
  cv::Mat::~Mat(local_90);
  cv::Mat::~Mat((Mat *)local_150);
  cv::Mat::~Mat(local_f0);
  cv::Mat::~Mat((Mat *)local_588);
  cv::Mat::~Mat((Mat *)local_390);
  cv::Mat::~Mat(local_330);
  return;
}

Assistant:

void lts2::RealReconstructionWithTVL1(cv::Mat &x, LBDOperator &LBD, cv::Mat const &binaryDescriptor,
                                     int iterations, float lambda, cv::Size patchSize, float patchMean)
{
  // Numerical parameters
  float L2 = 8.0f + LBD.norm() * LBD.norm();    // 8 is for TV
  float tau = 1.0f / std::sqrt(L2);   // L^2 * tau * sigma = 1
  float sigma = 1.0f / std::sqrt(L2); // L^2 * tau * sigma = 1

  // Auxiliary variables
  cv::Mat u_, Au, u_n, u_nm1, Du1, Du2;
  cv::Mat p1, p2, divP;       // Dual variables for TV
  cv::Mat q;                  // Dual variable for A

  // We observe g, hence g and Au have the same dimensions
  Au.create(binaryDescriptor.size(), CV_32F);
  Au.setTo(cv::Scalar(0));

  // The size of u may not be the same as the size of g (e.g. A is a projection)
  // so we guess the size of u either from a non-zero input, or from the application
  // of A^t.
  if (x.data)
    x.copyTo(u_n);
  else
  {
    LBD.ApplyConjugate(binaryDescriptor, u_n);
    u_n.setTo(cv::Scalar(0));
  }

  u_n.copyTo(u_);

  p1.create(u_.size(), CV_32FC1);
  p1.setTo(cv::Scalar(0));
  p2.create(u_.size(), CV_32FC1);
  p2.setTo(cv::Scalar(0));

  q.create(binaryDescriptor.size(), CV_32F);
  q.setTo(cv::Scalar(0));

  // Main loop
  for (int i = 0; i < iterations; ++i)
  {
    //-------------------------------
    // Solve the dual (F^\star, K)
    //-------------------------------

    // K = (\nabla, A)
    // Apply K to U_, add to the dual variable

    // First part: TV
    lts2::HorizontalGradientWithForwardScheme(u_, Du1);
    Du1 *= sigma;
    p1 += Du1;

    lts2::VerticalGradientWithForwardScheme(u_, Du2);
    Du2 *= sigma;
    p2 += Du2;

    lts2::ProxL2UnitBall(p1, p2);

    // Second part: Au
    LBD.Apply(u_, Au);
    Au -= binaryDescriptor;
    Au *= sigma;
    q += Au;
    lts2::ProxRangeConstraint(q, -lambda, lambda);

    // Compute the prox

    //-------------------------------
    // Solve the primal (G, K^\star)
    //-------------------------------

    // Save the current estimate
    u_n.copyTo(u_nm1);

    // Apply K^\star to the dual variable
    // TV
    lts2::DivergenceWithBackwardScheme(p1, p2, divP);
    divP *= tau;

    // Operator A
    LBD.ApplyConjugate(q, Au);
    Au *= tau;

    // Solve the prox                                                                                                                                                   
    u_n -= Au;
    u_n += divP;

    // Enforce the range of the data [0, 1] and the mean
    if (!u_n.isContinuous())
      std::cerr << "OOOOOOPS, things can go wild..." << std::endl;

    lts2::ProxMeanConstraint(u_n, patchMean);
    lts2::ProxRangeConstraint(u_n, 0.0, 1.0);

    //-------------------------------
    // Next iteration
    //-------------------------------
    u_ = 2.0f * u_n - u_nm1;
  }

  u_n.copyTo(x);
}